

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[10],char_const*,char[4],char[28],unsigned_long,char[35]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [10],char **Args_1,
          char (*Args_2) [4],char (*Args_3) [28],unsigned_long *Args_4,char (*Args_5) [35])

{
  stringstream local_1c0 [8];
  stringstream ss;
  unsigned_long *Args_local_4;
  char (*Args_local_3) [28];
  char (*Args_local_2) [4];
  char **Args_local_1;
  char (*Args_local) [10];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[4],char[28],unsigned_long,char[35]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [10])this,(char **)Args,(char (*) [4])Args_1,(char (*) [28])Args_2,
             (unsigned_long *)Args_3,(char (*) [35])Args_4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}